

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall DPlayerMenu::PlayerNameChanged(DPlayerMenu *this,FListMenuItem *li)

{
  uint uVar1;
  char *cmd;
  FString local_38;
  FString command;
  char *p;
  char pp [16];
  FListMenuItem *li_local;
  DPlayerMenu *this_local;
  
  pp._8_8_ = li;
  uVar1 = (*li->_vptr_FListMenuItem[9])(li,0,&p,0xf);
  if ((uVar1 & 1) != 0) {
    FString::FString(&local_38,"name \"");
    for (command.Chars = (char *)&p; *command.Chars != '\0'; command.Chars = command.Chars + 1) {
      if ((*command.Chars == '\"') || (*command.Chars == '\\')) {
        FString::operator<<(&local_38,'\\');
      }
      FString::operator<<(&local_38,*command.Chars);
    }
    FString::operator<<(&local_38,'\"');
    cmd = FString::operator_cast_to_char_(&local_38);
    C_DoCommand(cmd,0);
    FString::~FString(&local_38);
  }
  return;
}

Assistant:

void DPlayerMenu::PlayerNameChanged(FListMenuItem *li)
{
	char pp[MAXPLAYERNAME+1];
	const char *p;
	if (li->GetString(0, pp, MAXPLAYERNAME))
	{
		FString command("name \"");

		// Escape any backslashes or quotation marks before sending the name to the console.
		for (p = pp; *p != '\0'; ++p)
		{
			if (*p == '"' || *p == '\\')
			{
				command << '\\';
			}
			command << *p;
		}
		command << '"';
		C_DoCommand (command);
	}
}